

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_primitives_conversion.cpp
# Opt level: O2

void skiwi::anon_unknown_2::inline_ieee754_exponent(PrimitiveCall *p,Expression *e)

{
  string inline_name;
  bool safe_primitives;
  byte bVar1;
  undefined8 uVar2;
  string in_stack_ffffffffffffff48;
  string in_stack_ffffffffffffff68;
  string local_70 [32];
  string local_50 [32];
  
  bVar1 = (anonymous_namespace)::g_standard_bindings;
  safe_primitives = (bool)(anonymous_namespace)::g_safe_primitives;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffff70,"ieee754-exponent",
             (allocator<char> *)&stack0xffffffffffffff4f);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffff50,"##ieee754-exponent",
             (allocator<char> *)&stack0xffffffffffffff4e);
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"##flonum?",(allocator<char> *)&stack0xffffffffffffff4d);
  uVar2 = 0x1f452a;
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"",(allocator<char> *)&stack0xffffffffffffff4c);
  inline_name._M_string_length = (size_type)local_50;
  inline_name._M_dataplus._M_p = &stack0xffffffffffffff50;
  inline_name.field_2._M_allocated_capacity = (size_type)local_70;
  inline_name.field_2._8_8_ = uVar2;
  make_inline_procedure
            (p,e,1,(bool)(bVar1 ^ 1),safe_primitives,(string *)&stack0xffffffffffffff70,inline_name,
             in_stack_ffffffffffffff48,in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  return;
}

Assistant:

void inline_ieee754_exponent(PrimitiveCall& p, Expression& e)
    {
    make_inline_procedure(p, e, 1, !g_standard_bindings, g_safe_primitives, "ieee754-exponent", "##ieee754-exponent", "##flonum?");
    }